

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_GTK.cxx
# Opt level: O1

int __thiscall Fl_GTK_File_Chooser::fl_gtk_chooser_wrapper(Fl_GTK_File_Chooser *this)

{
  XX_gtk_file_chooser_set_current_name p_Var1;
  XX_gtk_file_filter_add_custom p_Var2;
  gboolean gVar3;
  int iVar4;
  guint gVar5;
  GtkWidget *pGVar6;
  long lVar7;
  gchar *pgVar8;
  GtkFileFilter *pGVar9;
  char *pcVar10;
  undefined8 *puVar11;
  Fl_Window *pFVar12;
  GdkWindow *pGVar13;
  Window WVar14;
  GSList *pGVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  GtkFileChooserAction GVar19;
  Window WVar20;
  undefined4 uVar21;
  uint uVar22;
  undefined8 unaff_RBP;
  char *pcVar23;
  undefined8 *puVar24;
  GSList *iter;
  gint response_id;
  undefined4 local_104;
  undefined8 *local_100;
  char *local_f8;
  int ac;
  Window aWStack_d0 [20];
  
  if (fl_gtk_chooser_wrapper()::have_gtk_init == '\0') {
    fl_gtk_chooser_wrapper()::have_gtk_init = '\x01';
    ac = 0;
    (*fl_gtk_init_check)(&ac,(char ***)0x0);
  }
  if (this->gtkw_ptr != (GtkWidget *)0x0) {
    (*fl_gtk_widget_destroy)(this->gtkw_ptr);
    this->gtkw_ptr = (GtkWidget *)0x0;
  }
  pcVar23 = "gtk-open";
  GVar19 = GTK_FILE_CHOOSER_ACTION_OPEN;
  switch((this->super_Fl_FLTK_File_Chooser)._btype) {
  case 1:
  case 3:
    GVar19 = GTK_FILE_CHOOSER_ACTION_SELECT_FOLDER;
    break;
  default:
    uVar21 = (undefined4)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    goto LAB_001c1dea;
  case 4:
    pcVar23 = "gtk-save";
    GVar19 = GTK_FILE_CHOOSER_ACTION_SAVE;
    break;
  case 5:
    pcVar23 = "gtk-save";
    GVar19 = GTK_FILE_CHOOSER_ACTION_CREATE_FOLDER;
  }
  uVar21 = 0;
LAB_001c1dea:
  pGVar6 = (*fl_gtk_file_chooser_dialog_new)
                     (this->gtkw_title,(GtkWindow *)0x0,GVar19,"gtk-cancel",0xfffffffa,pcVar23,
                      0xfffffffffffffffd,0);
  this->gtkw_ptr = pGVar6;
  p_Var1 = fl_gtk_file_chooser_set_current_name;
  if (pGVar6 == (GtkWidget *)0x0) {
    return -1;
  }
  iVar4 = (this->super_Fl_FLTK_File_Chooser)._btype;
  if (iVar4 - 2U < 2) {
    (*fl_gtk_file_chooser_set_select_multiple)((GtkFileChooser *)pGVar6,1);
  }
  else {
    if (iVar4 == 4) {
      pcVar23 = (this->super_Fl_FLTK_File_Chooser)._preset_file;
      if (pcVar23 != (char *)0x0) {
        pcVar23 = fl_filename_name(pcVar23);
        (*p_Var1)((GtkFileChooser *)pGVar6,pcVar23);
      }
    }
    else if (iVar4 != 5) goto LAB_001c1e8c;
    (*fl_gtk_file_chooser_set_create_folders)((GtkFileChooser *)this->gtkw_ptr,1);
    (*fl_gtk_file_chooser_set_do_overwrite_confirmation)
              ((GtkFileChooser *)this->gtkw_ptr,(this->super_Fl_FLTK_File_Chooser)._options & 1);
  }
LAB_001c1e8c:
  pcVar23 = (this->super_Fl_FLTK_File_Chooser)._directory;
  if ((((pcVar23 != (char *)0x0) && (*pcVar23 != '\0')) ||
      (pcVar23 = (this->super_Fl_FLTK_File_Chooser)._preset_file, pcVar23 != (char *)0x0)) &&
     (pcVar23 = extract_dir_from_path(pcVar23), pcVar23 != (char *)0x0)) {
    (*fl_gtk_file_chooser_set_current_folder)((GtkFileChooser *)this->gtkw_ptr,pcVar23);
  }
  pcVar23 = (this->super_Fl_FLTK_File_Chooser)._parsedfilt;
  if (pcVar23 == (char *)0x0) {
    puVar24 = (undefined8 *)0x0;
  }
  else {
    lVar7 = (long)(this->super_Fl_FLTK_File_Chooser)._nfilters;
    uVar18 = 0xffffffffffffffff;
    if (-1 < lVar7) {
      uVar18 = lVar7 * 8;
    }
    local_104 = uVar21;
    local_100 = (undefined8 *)operator_new__(uVar18);
    local_f8 = strdup(pcVar23);
    pgVar8 = strtok(local_f8,"\t");
    puVar24 = local_100;
    while (pgVar8 != (gchar *)0x0) {
      pGVar9 = (*fl_gtk_file_filter_new)();
      *puVar24 = pGVar9;
      (*fl_gtk_file_filter_set_name)(pGVar9,pgVar8);
      pcVar23 = strchr(pgVar8,0x28);
      pcVar10 = strchr(pcVar23 + 1,0x29);
      *pcVar10 = '\0';
      p_Var2 = fl_gtk_file_filter_add_custom;
      pGVar9 = (GtkFileFilter *)*puVar24;
      puVar11 = (undefined8 *)operator_new(0x10);
      *puVar11 = this;
      pcVar23 = strdup(pcVar23 + 1);
      puVar11[1] = pcVar23;
      (*p_Var2)(pGVar9,GTK_FILE_FILTER_FILENAME,custom_gtk_filter_function,puVar11,free_pair);
      (*fl_gtk_file_chooser_add_filter)((GtkFileChooser *)this->gtkw_ptr,(GtkFileFilter *)*puVar24);
      pgVar8 = strtok((char *)0x0,"\t");
      puVar24 = puVar24 + 1;
    }
    free(local_f8);
    puVar24 = local_100;
    iVar4 = (this->super_Fl_FLTK_File_Chooser)._filtvalue;
    iVar16 = 0;
    if (iVar4 < (this->super_Fl_FLTK_File_Chooser)._nfilters) {
      iVar16 = iVar4;
    }
    (*fl_gtk_file_chooser_set_filter)
              ((GtkFileChooser *)this->gtkw_ptr,(GtkFileFilter *)local_100[iVar16]);
    this->previous_filter = (char *)0x0;
    if ((char)local_104 != '\0') {
      pGVar9 = (*fl_gtk_file_filter_new)();
      (*fl_gtk_file_filter_set_name)(pGVar9,Fl_File_Chooser::all_files_label);
      (*fl_gtk_file_filter_add_pattern)(pGVar9,"*");
      (*fl_gtk_file_chooser_add_filter)((GtkFileChooser *)this->gtkw_ptr,pGVar9);
    }
  }
  pGVar6 = (*fl_gtk_check_button_new_with_label)(Fl_File_Chooser::hidden_label);
  (*fl_gtk_file_chooser_set_extra_widget)((GtkFileChooser *)this->gtkw_ptr,pGVar6);
  (*fl_g_signal_connect_data)(pGVar6,"toggled",hidden_files_cb,this->gtkw_ptr,(GClosureNotify)0x0,0)
  ;
  pFVar12 = Fl::first_window();
  (*fl_gtk_widget_show_now)(this->gtkw_ptr);
  if (pFVar12 != (Fl_Window *)0x0) {
    pGVar13 = (*fl_gtk_widget_get_window)(this->gtkw_ptr);
    WVar14 = (*fl_gdk_x11_drawable_get_xid)(pGVar13);
    if (pFVar12->i == (Fl_X *)0x0) {
      WVar20 = 0;
    }
    else {
      WVar20 = pFVar12->i->xid;
    }
    XSetTransientForHint(fl_display,WVar14,WVar20);
  }
  gVar3 = (*fl_gtk_file_chooser_get_show_hidden)((GtkFileChooser *)this->gtkw_ptr);
  (*fl_gtk_toggle_button_set_active)((GtkToggleButton *)pGVar6,gVar3);
  response_id = -1;
  (*fl_g_signal_connect_data)
            (this->gtkw_ptr,"response",run_response_handler,&response_id,(GClosureNotify)0x0,0);
  while (response_id == -1) {
    (*fl_gtk_main_iteration)();
    while (iVar4 = XEventsQueued(fl_display,1), iVar4 != 0) {
      XNextEvent(fl_display,(XEvent *)&ac);
      pFVar12 = fl_find(aWStack_d0[ac == 0x16]);
      if ((pFVar12 != (Fl_Window *)0x0) && ((ac == 0x16 || (ac == 0xc)))) {
        fl_handle((XEvent *)&ac);
      }
    }
    Fl::flush();
  }
  if (response_id == -3) {
    if ((this->super_Fl_FLTK_File_Chooser)._parsedfilt != (char *)0x0) {
      pGVar9 = (*fl_gtk_file_chooser_get_filter)((GtkFileChooser *)this->gtkw_ptr);
      uVar22 = (this->super_Fl_FLTK_File_Chooser)._nfilters;
      uVar17 = 0;
      uVar18 = uVar17;
      if (0 < (int)uVar22) {
        do {
          uVar18 = uVar17;
          if ((GtkFileFilter *)puVar24[uVar17] == pGVar9) break;
          uVar17 = uVar17 + 1;
          uVar18 = (ulong)uVar22;
        } while (uVar22 != uVar17);
      }
      (this->super_Fl_FLTK_File_Chooser)._filtvalue = (int)uVar18;
    }
    if (this->gtkw_filename != (char *)0x0) {
      (*fl_g_free)(this->gtkw_filename);
      this->gtkw_filename = (char *)0x0;
    }
    puVar11 = (undefined8 *)this->gtkw_slist;
    if (puVar11 != (undefined8 *)0x0) {
      do {
        if ((gpointer)*puVar11 != (gpointer)0x0) {
          (*fl_g_free)((gpointer)*puVar11);
        }
        puVar11 = (undefined8 *)puVar11[1];
      } while (puVar11 != (undefined8 *)0x0);
      (*fl_g_slist_free)((GSList *)this->gtkw_slist);
      this->gtkw_slist = (void *)0x0;
    }
    this->gtkw_count = 0;
    gVar3 = (*fl_gtk_file_chooser_get_select_multiple)((GtkFileChooser *)this->gtkw_ptr);
    if (gVar3 != 0) {
      pGVar15 = (*fl_gtk_file_chooser_get_filenames)((GtkFileChooser *)this->gtkw_ptr);
      this->gtkw_slist = pGVar15;
      gVar5 = (*fl_g_slist_length)(pGVar15);
      this->gtkw_count = gVar5;
      uVar22 = (uint)(gVar5 == 0);
      goto LAB_001c224e;
    }
    pgVar8 = (*fl_gtk_file_chooser_get_filename)((GtkFileChooser *)this->gtkw_ptr);
    this->gtkw_filename = pgVar8;
    if (pgVar8 != (gchar *)0x0) {
      this->gtkw_count = 1;
      uVar22 = 0;
      goto LAB_001c224e;
    }
  }
  uVar22 = 1;
LAB_001c224e:
  if (puVar24 != (undefined8 *)0x0) {
    operator_delete__(puVar24);
  }
  if (response_id == -4) {
    this->gtkw_ptr = (GtkWidget *)0x0;
  }
  else {
    (*fl_gtk_widget_hide)(this->gtkw_ptr);
  }
  while (gVar3 = (*fl_gtk_events_pending)(), gVar3 != 0) {
    (*fl_gtk_main_iteration)();
  }
  return uVar22;
}

Assistant:

int Fl_GTK_File_Chooser::fl_gtk_chooser_wrapper()
{
  int result = 1;
  static int have_gtk_init = 0;
  char *p;
  
  if(!have_gtk_init) {
    have_gtk_init = -1;
    int ac = 0;
    fl_gtk_init_check(&ac, NULL);
  }
  
  if(gtkw_ptr) { // discard the previous dialog widget
    fl_gtk_widget_destroy (gtkw_ptr);
    gtkw_ptr = NULL;
  }
  
  // set the dialog action type
  GtkFileChooserAction gtw_action_type;
  switch (_btype) {
    case Fl_Native_File_Chooser::BROWSE_DIRECTORY:
    case Fl_Native_File_Chooser::BROWSE_MULTI_DIRECTORY:
      gtw_action_type = GTK_FILE_CHOOSER_ACTION_SELECT_FOLDER;
      break;
      
    case Fl_Native_File_Chooser::BROWSE_SAVE_FILE:
      gtw_action_type = GTK_FILE_CHOOSER_ACTION_SAVE;
      break;
      
    case Fl_Native_File_Chooser::BROWSE_SAVE_DIRECTORY:
      gtw_action_type = GTK_FILE_CHOOSER_ACTION_CREATE_FOLDER;
      break;
      
    case Fl_Native_File_Chooser::BROWSE_MULTI_FILE:
    case Fl_Native_File_Chooser::BROWSE_FILE:
    default:
      gtw_action_type = GTK_FILE_CHOOSER_ACTION_OPEN;
      break;
  }
  // create a new dialog
  gtkw_ptr = fl_gtk_file_chooser_dialog_new (gtkw_title,
					     NULL, /* parent_window */
					     gtw_action_type,
					     GTK_STOCK_CANCEL, GTK_RESPONSE_CANCEL,
					     gtw_action_type == GTK_FILE_CHOOSER_ACTION_SAVE || gtw_action_type == GTK_FILE_CHOOSER_ACTION_CREATE_FOLDER ? 
					     GTK_STOCK_SAVE : GTK_STOCK_OPEN, 
					     GTK_RESPONSE_ACCEPT,
					     NULL);
  // did we create a valid dialog widget?
  if(!gtkw_ptr) {
    // fail
    return -1;
  }
  
  // set the dialog properties
  switch (_btype) {
    case Fl_Native_File_Chooser::BROWSE_MULTI_DIRECTORY:
    case Fl_Native_File_Chooser::BROWSE_MULTI_FILE:
      fl_gtk_file_chooser_set_select_multiple((GtkFileChooser *)gtkw_ptr, TRUE);
      break;
      
    case Fl_Native_File_Chooser::BROWSE_SAVE_FILE:
      if (_preset_file)fl_gtk_file_chooser_set_current_name ((GtkFileChooser *)gtkw_ptr, fl_filename_name(_preset_file));
      /* FALLTHROUGH */
    case Fl_Native_File_Chooser::BROWSE_SAVE_DIRECTORY:
      fl_gtk_file_chooser_set_create_folders((GtkFileChooser *)gtkw_ptr, TRUE);
      fl_gtk_file_chooser_set_do_overwrite_confirmation ((GtkFileChooser *)gtkw_ptr, (_options & Fl_Native_File_Chooser::SAVEAS_CONFIRM)?TRUE:FALSE);
      break;
      
    case Fl_Native_File_Chooser::BROWSE_DIRECTORY:
    case Fl_Native_File_Chooser::BROWSE_FILE:
    default:
      break;
  }
  
  if (_directory && _directory[0]) {
    p = extract_dir_from_path(_directory);
    if (p) fl_gtk_file_chooser_set_current_folder((GtkFileChooser *)gtkw_ptr, p);
  }
  else if (_preset_file) {
    p = extract_dir_from_path(_preset_file);
    if (p) fl_gtk_file_chooser_set_current_folder((GtkFileChooser *)gtkw_ptr, p);
  }
  
  GtkFileFilter **filter_tab = NULL;
  if (_parsedfilt) {
    filter_tab = new GtkFileFilter*[_nfilters];
    char *filter = strdup(_parsedfilt);
    p = strtok(filter, "\t");
    int count = 0;
    while (p) {
      filter_tab[count] = fl_gtk_file_filter_new();
      fl_gtk_file_filter_set_name(filter_tab[count], p);
      p = strchr(p, '(') + 1;
      char *q = strchr(p, ')'); *q = 0;
      fl_gtk_file_filter_add_custom(filter_tab[count], 
				    GTK_FILE_FILTER_FILENAME, 
				    (GtkFileFilterFunc)Fl_GTK_File_Chooser::custom_gtk_filter_function, 
				    new Fl_GTK_File_Chooser::pair(this, p), 
				    (GDestroyNotify)Fl_GTK_File_Chooser::free_pair);
      fl_gtk_file_chooser_add_filter((GtkFileChooser *)gtkw_ptr, filter_tab[count]);
      p = strtok(NULL, "\t");
      count++;
    }
    free(filter);
    fl_gtk_file_chooser_set_filter((GtkFileChooser *)gtkw_ptr, filter_tab[_filtvalue < _nfilters?_filtvalue:0]);
    previous_filter = NULL;
    if (gtw_action_type == GTK_FILE_CHOOSER_ACTION_OPEN) {
      GtkFileFilter* gfilter = fl_gtk_file_filter_new();
      fl_gtk_file_filter_set_name(gfilter, Fl_File_Chooser::all_files_label);
      fl_gtk_file_filter_add_pattern(gfilter, "*");
      fl_gtk_file_chooser_add_filter((GtkFileChooser *)gtkw_ptr, gfilter);
    }
  }
  
  GtkWidget *toggle = fl_gtk_check_button_new_with_label(Fl_File_Chooser::hidden_label);
  fl_gtk_file_chooser_set_extra_widget((GtkFileChooser *)gtkw_ptr, toggle);
  fl_g_signal_connect_data(toggle, "toggled", G_CALLBACK(hidden_files_cb), gtkw_ptr, NULL, (GConnectFlags) 0);
  Fl_Window* firstw = Fl::first_window();
  fl_gtk_widget_show_now(gtkw_ptr); // map the GTK window on screen
  if (firstw) {
    GdkWindow* gdkw = fl_gtk_widget_get_window(gtkw_ptr);
    Window xw = fl_gdk_x11_drawable_get_xid(gdkw); // get the X11 ref of the GTK window
    XSetTransientForHint(fl_display, xw, fl_xid(firstw)); // set the GTK window transient for the last FLTK win
    }
  gboolean state = fl_gtk_file_chooser_get_show_hidden((GtkFileChooser *)gtkw_ptr);
  fl_gtk_toggle_button_set_active((GtkToggleButton *)toggle, state);
  
  gint response_id = GTK_RESPONSE_NONE;
  fl_g_signal_connect_data(gtkw_ptr, "response", G_CALLBACK(run_response_handler), &response_id, NULL, (GConnectFlags) 0);
  while (response_id == GTK_RESPONSE_NONE) { // loop that shows the GTK dialog window
    fl_gtk_main_iteration(); // one iteration of the GTK event loop
    while (XEventsQueued(fl_display, QueuedAfterReading)) { // emulate modal dialog
      XEvent xevent;
      XNextEvent(fl_display, &xevent);
      Window xid = xevent.xany.window;
      if (xevent.type == ConfigureNotify) xid = xevent.xmaprequest.window;
      if (!fl_find(xid)) continue; // skip events to non-FLTK windows
      // process Expose and ConfigureNotify events
      if ( xevent.type == Expose || xevent.type == ConfigureNotify ) fl_handle(xevent); 
    }
    Fl::flush(); // do the drawings needed after Expose events
  } 
  
  if (response_id == GTK_RESPONSE_ACCEPT) {
    if (_parsedfilt) {
      GtkFileFilter *gfilter = fl_gtk_file_chooser_get_filter((GtkFileChooser *)gtkw_ptr);
      for (_filtvalue = 0; _filtvalue < _nfilters; _filtvalue++) {
	if (filter_tab[_filtvalue] == gfilter) break;
      }
    }
    
    // discard any filenames or lists from previous calls
    if(gtkw_filename) {
      fl_g_free(gtkw_filename);
      gtkw_filename = NULL;
    }
    if(gtkw_slist) {
      GSList *iter = (GSList *)gtkw_slist;
      while(iter) {
        if(iter->data) fl_g_free(iter->data);
        iter = g_slist_next(iter);
      }
      fl_g_slist_free((GSList *)gtkw_slist);
      gtkw_slist = NULL;
    }
    gtkw_count = 0; // assume we have no files selected now
    
    if(fl_gtk_file_chooser_get_select_multiple((GtkFileChooser *)gtkw_ptr) == FALSE) {
      gtkw_filename = fl_gtk_file_chooser_get_filename ((GtkFileChooser *)gtkw_ptr);
      if (gtkw_filename) {
        gtkw_count = 1;
        result = 0;
        //printf("single: %s\n", gtkw_filename);
      }
    }
    else {
      gtkw_slist = fl_gtk_file_chooser_get_filenames((GtkFileChooser *)gtkw_ptr);
      gtkw_count = fl_g_slist_length((GSList *)gtkw_slist);
      if(gtkw_count) result = 0;
      
      //      puts("multiple");
      //      GSList *iter = (GSList *)gtkw_slist;
      //      printf ("Selected %d files\n", gtkw_count);
      //      while(iter) {
      //        char *nm = (char *)iter->data;
      //        printf("%s\n", nm);
      //        iter = g_slist_next(iter);
      //      }
    }
  }
  delete[] filter_tab;
  if ( response_id == GTK_RESPONSE_DELETE_EVENT) gtkw_ptr = NULL;
  else fl_gtk_widget_hide (gtkw_ptr);
  
  // I think this is analogus to doing an Fl::check() - we need this here to make sure
  // the GtkFileChooserDialog is removed from the display correctly
  while (fl_gtk_events_pending ()) fl_gtk_main_iteration (); 
  
  return result;
}